

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_error.hpp
# Opt level: O3

char * __thiscall boost::system::system_error::what(system_error *this)

{
  string *psVar1;
  char *pcVar2;
  error_category *peVar3;
  char *__s;
  long *local_40 [2];
  long local_30 [2];
  
  psVar1 = &this->m_what;
  if ((this->m_what)._M_string_length == 0) {
    __s = (char *)std::runtime_error::what();
    pcVar2 = (char *)(this->m_what)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)__s);
    if ((this->m_what)._M_string_length != 0) {
      std::__cxx11::string::append((char *)psVar1);
    }
    peVar3 = (this->m_error_code).m_cat;
    (*peVar3->_vptr_error_category[3])(local_40,peVar3,(ulong)(uint)(this->m_error_code).m_val);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

inline const char * system_error::what() const BOOST_NOEXCEPT_OR_NOTHROW
    // see http://www.boost.org/more/error_handling.html for lazy build rationale
    {
      if ( m_what.empty() )
      {
#ifndef BOOST_NO_EXCEPTIONS
        try
#endif
        {
          m_what = this->std::runtime_error::what();
          if ( !m_what.empty() ) m_what += ": ";
          m_what += m_error_code.message();
        }
#ifndef BOOST_NO_EXCEPTIONS
        catch (...) { return std::runtime_error::what(); }
#endif
      }
      return m_what.c_str();
    }